

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeClassBaseElements
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassElements *syntax
               )

{
  TypeClass *pTVar1;
  SynIdentifier *pSVar2;
  VariableData *pVVar3;
  int iVar4;
  ExprAliasDefinition *pEVar5;
  undefined4 extraout_var;
  ExprVariableDefinitions *pEVar6;
  MemberHandle *node_00;
  TypeBase *pTVar7;
  SynBase *pSVar8;
  ExprBase *pEVar9;
  SynConstant *in_R8;
  SynTypedef *syntax_00;
  SynVariableDefinitions *syntax_01;
  SynConstantSet *source;
  SynClassStaticIf *syntax_02;
  IntrusiveList<SynConstant> constants;
  MatchData *node;
  undefined4 extraout_var_00;
  
  syntax_00 = (syntax->typedefs).head;
  if (syntax_00 != (SynTypedef *)0x0) {
    do {
      pEVar5 = AnalyzeTypedef(ctx,syntax_00);
      pTVar1 = classDefinition->classType;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      node = (MatchData *)CONCAT44(extraout_var,iVar4);
      pTVar7 = pEVar5->alias->type;
      pSVar2 = pEVar5->alias->name;
      node->name = pSVar2;
      node->type = pTVar7;
      node->next = (MatchData *)0x0;
      node->listed = false;
      if (pSVar2 == (SynIdentifier *)0x0) {
        __assert_fail("name",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                      ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
      }
      IntrusiveList<MatchData>::push_back(&pTVar1->aliases,node);
      syntax_00 = (SynTypedef *)(syntax_00->super_SynBase).next;
    } while ((syntax_00 != (SynTypedef *)0x0) && ((syntax_00->super_SynBase).typeID == 0x16));
  }
  syntax_01 = (syntax->members).head;
  if (syntax_01 != (SynVariableDefinitions *)0x0) {
    do {
      pEVar6 = AnalyzeVariableDefinitions(ctx,syntax_01);
      for (pEVar9 = (pEVar6->definitions).head; pEVar9 != (ExprBase *)0x0; pEVar9 = pEVar9->next) {
        if ((pEVar9->type == (TypeBase *)0x0) || (pEVar9->type->typeID != 0)) {
          if (pEVar9->typeID != 0x1e) {
            __assert_fail("variableDefinition",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x28f9,
                          "void AnalyzeClassBaseElements(ExpressionContext &, ExprClassDefinition *, SynClassElements *)"
                         );
          }
          pSVar8 = pEVar9->source;
          if ((pSVar8 == (SynBase *)0x0) || (pSVar8->typeID != 0x33)) {
            pSVar8 = (SynBase *)0x0;
          }
          pTVar1 = classDefinition->classType;
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
          node_00 = (MemberHandle *)CONCAT44(extraout_var_00,iVar4);
          if (pSVar8 == (SynBase *)0x0) {
            pSVar8 = (SynBase *)0x0;
          }
          else {
            pSVar8 = *(SynBase **)&pSVar8[1].typeID;
          }
          pVVar3 = (VariableData *)pEVar9[1]._vptr_ExprBase[1];
          node_00->source = (SynBase *)*pEVar9[1]._vptr_ExprBase;
          node_00->variable = pVVar3;
          node_00->initializer = pSVar8;
          node_00->next = (MemberHandle *)0x0;
          node_00->listed = false;
          IntrusiveList<MemberHandle>::push_back(&(pTVar1->super_TypeStruct).members,node_00);
        }
      }
      syntax_01 = (SynVariableDefinitions *)(syntax_01->super_SynBase).next;
    } while ((syntax_01 != (SynVariableDefinitions *)0x0) &&
            ((syntax_01->super_SynBase).typeID == 0x34));
  }
  source = (syntax->constantSets).head;
  if (source != (SynConstantSet *)0x0) {
    do {
      pTVar7 = AnalyzeType(ctx,source->type,true,(bool *)0x0);
      constants.tail = in_R8;
      constants.head = (source->constants).head;
      AnalyzeClassConstants
                (ctx,&source->super_SynBase,pTVar7,constants,
                 &(classDefinition->classType->super_TypeStruct).constants);
      source = (SynConstantSet *)(source->super_SynBase).next;
      if (source == (SynConstantSet *)0x0) break;
    } while ((source->super_SynBase).typeID == 0x3b);
  }
  syntax_02 = (syntax->staticIfs).head;
  if (syntax_02 != (SynClassStaticIf *)0x0) {
    do {
      AnalyzeClassStaticIf(ctx,classDefinition,syntax_02,true);
      syntax_02 = (SynClassStaticIf *)(syntax_02->super_SynBase).next;
      if (syntax_02 == (SynClassStaticIf *)0x0) {
        return;
      }
    } while ((syntax_02->super_SynBase).typeID == 0x3d);
  }
  return;
}

Assistant:

void AnalyzeClassBaseElements(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassElements *syntax)
{
	for(SynTypedef *typeDef = syntax->typedefs.head; typeDef; typeDef = getType<SynTypedef>(typeDef->next))
	{
		ExprAliasDefinition *alias = AnalyzeTypedef(ctx, typeDef);

		classDefinition->classType->aliases.push_back(new (ctx.get<MatchData>()) MatchData(alias->alias->name, alias->alias->type));
	}

	{
		for(SynVariableDefinitions *member = syntax->members.head; member; member = getType<SynVariableDefinitions>(member->next))
		{
			ExprVariableDefinitions *node = AnalyzeVariableDefinitions(ctx, member);

			for(ExprBase *definition = node->definitions.head; definition; definition = definition->next)
			{
				if(isType<TypeError>(definition->type))
					continue;

				ExprVariableDefinition *variableDefinition = getType<ExprVariableDefinition>(definition);

				assert(variableDefinition);

				SynVariableDefinition *sourceDefinition = getType<SynVariableDefinition>(definition->source);

				classDefinition->classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(variableDefinition->variable->source, variableDefinition->variable->variable, sourceDefinition ? sourceDefinition->initializer : NULL));
			}
		}
	}

	for(SynConstantSet *constantSet = syntax->constantSets.head; constantSet; constantSet = getType<SynConstantSet>(constantSet->next))
	{
		TypeBase *type = AnalyzeType(ctx, constantSet->type);

		AnalyzeClassConstants(ctx, constantSet, type, constantSet->constants, classDefinition->classType->constants);
	}

	// TODO: The way SynClassElements is made, it could allow member re-ordering! class should contain in-order members and static if's
	// TODO: We should be able to analyze all static if typedefs before members and constants and analyze them before functions
	for(SynClassStaticIf *staticIf = syntax->staticIfs.head; staticIf; staticIf = getType<SynClassStaticIf>(staticIf->next))
		AnalyzeClassStaticIf(ctx, classDefinition, staticIf, true);
}